

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

string * __thiscall
cmCPackIFWGenerator::GetRootPackageName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this)

{
  char *pcVar1;
  cmCPackIFWPackage package;
  allocator local_221;
  string local_220;
  cmCPackIFWPackage local_200;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"root",(allocator *)&local_200);
  std::__cxx11::string::string
            ((string *)&local_200,"CPACK_IFW_PACKAGE_GROUP",(allocator *)&local_220);
  pcVar1 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_200.DisplayName);
  std::__cxx11::string::~string((string *)&local_200);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_200,"CPACK_IFW_PACKAGE_NAME",(allocator *)&local_220);
    pcVar1 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_200.DisplayName);
    std::__cxx11::string::~string((string *)&local_200);
    if (pcVar1 == (char *)0x0) {
      std::__cxx11::string::string
                ((string *)&local_200,"CPACK_PACKAGE_NAME",(allocator *)&local_220);
      pcVar1 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_200.DisplayName);
      std::__cxx11::string::~string((string *)&local_200);
      if (pcVar1 != (char *)0x0) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
      }
    }
    else {
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
  }
  else {
    cmCPackIFWPackage::cmCPackIFWPackage(&local_200);
    local_200.Generator = this;
    std::__cxx11::string::string((string *)&local_220,pcVar1,&local_221);
    cmCPackIFWPackage::ConfigureFromGroup(&local_200,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    cmCPackIFWPackage::~cmCPackIFWPackage(&local_200);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetRootPackageName()
{
  // Default value
  std::string name = "root";
  if (const char* optIFW_PACKAGE_GROUP =
      this->GetOption("CPACK_IFW_PACKAGE_GROUP"))
    {
    // Configure from root group
    cmCPackIFWPackage package;
    package.Generator = this;
    package.ConfigureFromGroup(optIFW_PACKAGE_GROUP);
    name = package.Name;
    }
  else if (const char* optIFW_PACKAGE_NAME =
           this->GetOption("CPACK_IFW_PACKAGE_NAME"))
    {
    // Configure from root package name
    name = optIFW_PACKAGE_NAME;
    }
  else if (const char* optPACKAGE_NAME =
           this->GetOption("CPACK_PACKAGE_NAME"))
    {
    // Configure from package name
    name = optPACKAGE_NAME;
    }
  return name;
}